

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall imrt::Plan::Plan(Plan *this,Plan *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator s;
  Station *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  Station *aux;
  const_iterator it;
  Station *in_stack_ffffffffffffff48;
  Plan *in_stack_ffffffffffffff50;
  key_type_conflict *__k;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *this_01;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this_02;
  _Self local_30;
  Station *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__Plan_0018bb10;
  this_01 = (map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
             *)(in_RDI + 1);
  std::
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  ::map((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
         *)0x1649ac);
  __x = (vector<double,_std::allocator<double>_> *)(in_RDI + 7);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x1649bf);
  in_RDI[0xb] = 0;
  this_02 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xc);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1649da);
  in_RDI[0xf] = *(undefined8 *)(in_RSI + 0x78);
  std::vector<double,_std::allocator<double>_>::vector(this_02,__x);
  __k = (key_type_conflict *)(in_RDI + 0x13);
  std::vector<double,_std::allocator<double>_>::vector(this_02,__x);
  std::vector<double,_std::allocator<double>_>::vector(this_02,__x);
  s = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                 in_stack_ffffffffffffff48);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                   ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                    in_stack_ffffffffffffff48);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,&local_30);
    if (!bVar1) break;
    this_00 = (Station *)operator_new(0x170);
    std::_List_const_iterator<imrt::Station_*>::operator*
              ((_List_const_iterator<imrt::Station_*> *)in_stack_ffffffffffffff50);
    Station::Station(in_stack_ffffffffffffffe0,(Station *)s._M_node);
    if (*(long *)(in_RSI + 0x58) != 0) {
      iVar2 = Station::getAngle(*(Station **)(in_RSI + 0x58));
      iVar3 = Station::getAngle(this_00);
      if (iVar2 == iVar3) {
        in_RDI[0xb] = this_00;
      }
    }
    add_station(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Station::getAngle(this_00);
    in_stack_ffffffffffffff50 =
         (Plan *)std::
                 map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                 ::operator[](this_01,__k);
    in_stack_ffffffffffffff50->_vptr_Plan = (_func_int **)this_00;
    std::_List_const_iterator<imrt::Station_*>::operator++
              ((_List_const_iterator<imrt::Station_*> *)&stack0xffffffffffffffd8,0);
  }
  in_RDI[0x19] = *(undefined8 *)(in_RSI + 200);
  return;
}

Assistant:

Plan::Plan(const Plan &p): ev(p.ev), w(p.w), Zmin(p.Zmin), Zmax(p.Zmax), last_changed(NULL) {
    //EvaluationFunction aux_ev(p.ev);
    //ev=aux_ev;
    for (list<Station*>::const_iterator it=p.stations.begin();it!=p.stations.end();it++) {
      Station* aux = new Station(**it);
      if (p.last_changed && p.last_changed->getAngle()==aux->getAngle()) last_changed=aux;
      add_station(*aux);
      angle2station[aux->getAngle()]=aux;
      //real_stations.push_back(*aux);
    }
    evaluation_fx=p.evaluation_fx;
  }